

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O2

void __thiscall
soplex::SPxMainSM<double>::FixVariablePS::FixVariablePS
          (FixVariablePS *this,SPxLPBase<double> *lp,SPxMainSM<double> *simplifier,int _j,double val
          ,shared_ptr<soplex::Tolerances> *tols,bool correctIdx)

{
  double dVar1;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  PostStep::PostStep(&this->super_PostStep,"FixVariable",(shared_ptr<soplex::Tolerances> *)&local_40
                     ,(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum,
                     (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__FixVariablePS_00333f68;
  this->m_j = _j;
  this->m_old_j = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum + -1;
  this->m_val = val;
  this->m_obj = -(lp->super_LPColSetBase<double>).object.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[_j];
  this->m_lower =
       (lp->super_LPColSetBase<double>).low.val.super__Vector_base<double,_std::allocator<double>_>.
       _M_impl.super__Vector_impl_data._M_start[_j];
  this->m_upper =
       (lp->super_LPColSetBase<double>).up.val.super__Vector_base<double,_std::allocator<double>_>.
       _M_impl.super__Vector_impl_data._M_start[_j];
  this->m_correctIdx = correctIdx;
  DSVectorBase<double>::DSVectorBase<double>
            (&this->m_col,
             (SVectorBase<double> *)
             ((lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem +
             (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[_j].idx));
  dVar1 = (lp->super_LPColSetBase<double>).object.val.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[this->m_j];
  if (lp->thesense == MINIMIZE) {
    dVar1 = -dVar1;
  }
  (*(simplifier->super_SPxSimplifier<double>)._vptr_SPxSimplifier[0x11])
            (dVar1 * this->m_val,simplifier);
  return;
}

Assistant:

FixVariablePS(const SPxLPBase<R>& lp, SPxMainSM& simplifier, int _j, const R val,
                    std::shared_ptr<Tolerances> tols, bool correctIdx = true)
         : PostStep("FixVariable", tols, lp.nRows(), lp.nCols())
         , m_j(_j)
         , m_old_j(lp.nCols() - 1)
         , m_val(val)
         , m_obj(lp.spxSense() == SPxLPBase<R>::MINIMIZE ? lp.obj(_j) : -lp.obj(_j))
         , m_lower(lp.lower(_j))
         , m_upper(lp.upper(_j))
         , m_correctIdx(correctIdx)
         , m_col(lp.colVector(_j))
      {
         simplifier.addObjoffset(m_val * lp.obj(m_j));
      }